

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstexprConstructor
          (MessageGenerator *this,Printer *p)

{
  Options *options;
  Descriptor *this_00;
  Printer *pPVar1;
  bool bVar2;
  Options *in_RCX;
  _Array_type *options_00;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  c;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Formatter format;
  anon_class_1_0_00000001 local_299;
  Printer *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  undefined8 local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  undefined8 local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  undefined1 local_230 [24];
  code *local_218;
  byte local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_1e0;
  string local_198;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_178;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_160;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_148;
  Options local_130;
  Printer *local_58;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  options = &this->options_;
  local_298 = p;
  bVar2 = ShouldGenerateClass(this->descriptor_,options);
  pPVar1 = local_298;
  if (!bVar2) {
    return;
  }
  this_00 = this->descriptor_;
  Options::Options(&local_130,options);
  cpp::anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)&local_250,(anon_unknown_0 *)this_00,(Descriptor *)&local_130,in_RCX);
  vars.len_ = ((long)(local_250._8_8_ - local_250._0_8_) >> 3) * -0x2c8590b21642c859;
  vars.ptr_ = (pointer)local_250._M_allocated_capacity;
  io::Printer::WithDefs(&local_148,pPVar1,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_250);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_130.field_listener_options.forbidden_field_listener_events.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.annotation_guard_name._M_dataplus._M_p !=
      &local_130.annotation_guard_name.field_2) {
    operator_delete(local_130.annotation_guard_name._M_dataplus._M_p,
                    local_130.annotation_guard_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.annotation_pragma_name._M_dataplus._M_p !=
      &local_130.annotation_pragma_name.field_2) {
    operator_delete(local_130.annotation_pragma_name._M_dataplus._M_p,
                    local_130.annotation_pragma_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.runtime_include_base._M_dataplus._M_p != &local_130.runtime_include_base.field_2)
  {
    operator_delete(local_130.runtime_include_base._M_dataplus._M_p,
                    local_130.runtime_include_base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.dllexport_decl._M_dataplus._M_p != &local_130.dllexport_decl.field_2) {
    operator_delete(local_130.dllexport_decl._M_dataplus._M_p,
                    local_130.dllexport_decl.field_2._M_allocated_capacity + 1);
  }
  pPVar1 = local_298;
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)&local_250,this->descriptor_,options);
  vars_00.len_ = ((long)(local_250._8_8_ - local_250._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = (pointer)local_250._M_allocated_capacity;
  io::Printer::WithDefs(&local_160,pPVar1,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_250);
  pPVar1 = local_298;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"constexpr","");
  io::Printer::Sub::Sub<char_const(&)[19]>
            ((Sub *)&local_250,&local_198,(char (*) [19])"PROTOBUF_CONSTEXPR");
  vars_01.len_ = 1;
  vars_01.ptr_ = (pointer)&local_250;
  io::Printer::WithDefs(&local_178,pPVar1,vars_01,false);
  if (local_1e0._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_1e0);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,
                    CONCAT71(local_1f8._M_allocated_capacity._1_7_,local_1f8._M_local_buf[0]) + 1);
  }
  options_00 = &std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                ::_S_vtable;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_210]._M_data)
            ((anon_class_1_0_00000001 *)&local_58,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_230);
  local_210 = 0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_allocated_capacity != &local_240) {
    operator_delete((void *)local_250._M_allocated_capacity,local_240._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_58 = local_298;
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  if ((this->descriptor_->options_->field_0)._impl_.map_entry_ == false) {
    SimpleBaseClass_abi_cxx11_
              ((string *)&local_250,(cpp *)this->descriptor_,(Descriptor *)options,
               (Options *)options_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_allocated_capacity != &local_240) {
      operator_delete((void *)local_250._M_allocated_capacity,local_240._M_allocated_capacity + 1);
    }
    if (local_250._8_8_ == 0) {
      io::Printer::Emit(local_298,0,0,1,"\n");
      pPVar1 = local_298;
      local_290 = &local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"init","");
      if (local_290 == &local_280) {
        local_240._8_8_ = local_280._8_8_;
        local_250._M_allocated_capacity = (size_type)&local_240;
      }
      else {
        local_250._M_allocated_capacity = (size_type)local_290;
      }
      local_240._M_allocated_capacity._1_7_ = local_280._M_allocated_capacity._1_7_;
      local_240._M_local_buf[0] = local_280._M_local_buf[0];
      local_250._8_8_ = local_288;
      local_288 = 0;
      local_280._M_local_buf[0] = '\0';
      local_290 = &local_280;
      local_230._0_8_ = operator_new(0x18);
      *(MessageGenerator **)local_230._0_8_ = this;
      *(Printer ***)(local_230._0_8_ + 8) = &local_298;
      *(undefined1 *)(local_230._0_8_ + 0x10) = 0;
      local_218 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_230._8_8_ = 0;
      local_230._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_210 = 1;
      local_208 = &local_1f8;
      local_200 = 0;
      local_1f8._M_local_buf[0] = '\0';
      local_1e8 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)0x0,0x53a374);
      local_1e0._M_engaged = false;
      io::Printer::Emit(pPVar1,&local_250,1,0xa7,
                        "\n            inline constexpr $classname$::Impl_::Impl_(\n                ::_pbi::ConstantInitialized) noexcept\n                //~\n                $init$ {}\n          "
                       );
      if (local_1e0._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_1e0);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,
                        CONCAT71(local_1f8._M_allocated_capacity._1_7_,local_1f8._M_local_buf[0]) +
                        1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_210]._M_data)
                (&local_299,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)local_230);
      local_210 = 0xff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_allocated_capacity != &local_240) {
        operator_delete((void *)local_250._M_allocated_capacity,local_240._M_allocated_capacity + 1)
        ;
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,
                        CONCAT71(local_280._M_allocated_capacity._1_7_,local_280._M_local_buf[0]) +
                        1);
      }
      io::Printer::Emit(local_298,0,0,1,"\n");
      io::Printer::Emit(local_298,0,0,0x16f,
                        "\n        template <typename>\n        $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n            : $superclass$($classname$_class_data_.base()),\n#else   // PROTOBUF_CUSTOM_VTABLE\n            : $superclass$(),\n#endif  // PROTOBUF_CUSTOM_VTABLE\n              _impl_(::_pbi::ConstantInitialized()) {\n        }\n      "
                       );
      goto LAB_00260358;
    }
  }
  pPVar1 = local_298;
  local_270 = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"base","");
  if (local_270 == &local_260) {
    local_240._8_8_ = local_260._8_8_;
    local_250._M_allocated_capacity = (size_type)&local_240;
  }
  else {
    local_250._M_allocated_capacity = (size_type)local_270;
  }
  local_240._M_allocated_capacity._1_7_ = local_260._M_allocated_capacity._1_7_;
  local_240._M_local_buf[0] = local_260._M_local_buf[0];
  local_250._8_8_ = local_268;
  local_268 = 0;
  local_260._M_local_buf[0] = '\0';
  local_270 = &local_260;
  local_230._0_8_ = operator_new(0x18);
  *(MessageGenerator **)local_230._0_8_ = this;
  *(Printer ***)(local_230._0_8_ + 8) = &local_298;
  *(undefined1 *)(local_230._0_8_ + 0x10) = 0;
  local_218 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_230._8_8_ = 0;
  local_230._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_210 = 1;
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)0x0,0x53a374);
  local_1e0._M_engaged = false;
  io::Printer::Emit(pPVar1,&local_250,1,0x1d1,
                    "\n              //~ Templatize constexpr constructor as a workaround for a bug in\n              //~ gcc 12 (warning in gcc 13).\n              template <typename>\n              $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                  : $base$($classname$_class_data_.base()){}\n#else   // PROTOBUF_CUSTOM_VTABLE\n                  : $base$() {\n              }\n#endif  // PROTOBUF_CUSTOM_VTABLE\n            "
                   );
  if (local_1e0._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_1e0);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,
                    CONCAT71(local_1f8._M_allocated_capacity._1_7_,local_1f8._M_local_buf[0]) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_210]._M_data)
            (&local_299,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_230);
  local_210 = 0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_allocated_capacity != &local_240) {
    operator_delete((void *)local_250._M_allocated_capacity,local_240._M_allocated_capacity + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,
                    CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]) + 1);
  }
LAB_00260358:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_50);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_178);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_160);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_148);
  return;
}

Assistant:

void MessageGenerator::GenerateConstexprConstructor(io::Printer* p) {
  if (!ShouldGenerateClass(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  auto c = p->WithVars({{"constexpr", "PROTOBUF_CONSTEXPR"}});
  Formatter format(p);

  if (IsMapEntryMessage(descriptor_) || !HasImplData(descriptor_, options_)) {
    p->Emit({{"base",
              [&] {
                if (IsMapEntryMessage(descriptor_)) {
                  p->Emit("$classname$::MapEntry");
                } else {
                  p->Emit("$superclass$");
                }
              }}},
            R"cc(
              //~ Templatize constexpr constructor as a workaround for a bug in
              //~ gcc 12 (warning in gcc 13).
              template <typename>
              $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)
#if defined(PROTOBUF_CUSTOM_VTABLE)
                  : $base$($classname$_class_data_.base()){}
#else   // PROTOBUF_CUSTOM_VTABLE
                  : $base$() {
              }
#endif  // PROTOBUF_CUSTOM_VTABLE
            )cc");
    return;
  }

  // Generate Impl_::Imp_(::_pbi::ConstantInitialized);
  // We use separate p->Emit() calls for LF and #ifdefs as they result in
  // awkward layout and more awkward indenting of the function statement.
  p->Emit("\n");
  p->Emit({{"init", [&] { GenerateImplMemberInit(p, InitType::kConstexpr); }}},
          R"cc(
            inline constexpr $classname$::Impl_::Impl_(
                ::_pbi::ConstantInitialized) noexcept
                //~
                $init$ {}
          )cc");
  p->Emit("\n");

  p->Emit(
      R"cc(
        template <typename>
        $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)
#if defined(PROTOBUF_CUSTOM_VTABLE)
            : $superclass$($classname$_class_data_.base()),
#else   // PROTOBUF_CUSTOM_VTABLE
            : $superclass$(),
#endif  // PROTOBUF_CUSTOM_VTABLE
              _impl_(::_pbi::ConstantInitialized()) {
        }
      )cc");
}